

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImgProcessor.cpp
# Opt level: O2

void __thiscall pobr::imgProcessing::ImgProcessor::loadImg(ImgProcessor *this,string *imgPath)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [3];
  
  cv::imread((string *)local_78,(int)imgPath);
  cv::Mat::operator=(&this->img,(Mat *)local_78);
  cv::Mat::~Mat((Mat *)local_78);
  cVar1 = cv::Mat::empty();
  if (cVar1 != '\0') {
    std::operator+(&bStack_98,"Could not properly load image \"",imgPath);
    std::operator+(local_78,&bStack_98,"\"...");
    pobr::utils::Logger::warning(local_78);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)&bStack_98);
  }
  return;
}

Assistant:

const void
ImgProcessor::loadImg(const std::string& imgPath)
{
    this->img = cv::imread(imgPath);

    if (this->img.empty()) {
        Logger::warning("Could not properly load image \"" + imgPath + "\"...");
    }
}